

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PortSymbols.cpp
# Opt level: O1

PortConnection * __thiscall
slang::ast::anon_unknown_0::PortConnectionBuilder::getInterfaceExpr
          (PortConnectionBuilder *this,InterfacePortSymbol *port,PropertyExprSyntax *syntax,
          span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> attributes)

{
  ExpressionSyntax *syntax_00;
  PortConnection *pPVar1;
  ASTContext context;
  pair<std::pair<const_slang::ast::Symbol_*,_const_slang::ast::ModportSymbol_*>,_const_slang::ast::Expression_*>
  local_78;
  ASTContext local_60;
  
  local_60.scope.ptr = this->scope;
  local_60.lookupIndex = (this->lookupLocation).index;
  local_60.flags.m_bits = 0x20;
  local_60.instanceOrProc = (Symbol *)0x0;
  local_60.firstTempVar = (TempVarSymbol *)0x0;
  local_60.randomizeDetails = (RandomizeDetails *)0x0;
  local_60.assertionInstance = (AssertionInstanceDetails *)0x0;
  syntax_00 = ASTContext::requireSimpleExpr(&local_60,syntax);
  if (syntax_00 == (ExpressionSyntax *)0x0) {
    pPVar1 = BumpAllocator::
             emplace<slang::ast::PortConnection,slang::ast::InterfacePortSymbol_const&>
                       (&this->comp->super_BumpAllocator,port);
  }
  else {
    getInterfaceConn(&local_78,this,&local_60,port,syntax_00);
    pPVar1 = createConnection(this,port,local_78.first,local_78.second,attributes);
  }
  return pPVar1;
}

Assistant:

PortConnection* getInterfaceExpr(const InterfacePortSymbol& port,
                                     const PropertyExprSyntax& syntax,
                                     std::span<const AttributeSymbol* const> attributes) {
        ASTContext context(scope, lookupLocation, ASTFlags::NonProcedural);
        auto expr = context.requireSimpleExpr(syntax);
        if (!expr)
            return emptyConnection(port);

        auto [conn, connExpr] = getInterfaceConn(context, port, *expr);
        return createConnection(port, conn, connExpr, attributes);
    }